

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManage.cpp
# Opt level: O2

bool free_memory(uint adr,int type)

{
  uint uVar1;
  MemoryNode *pMVar2;
  MemoryNode **ppMVar3;
  MemoryNode *pMVar4;
  MemoryNode **ppMVar5;
  MemoryNode *pMVar6;
  MemoryNode *pMVar7;
  
  if (type == 0) {
    ppMVar3 = &data_free_memory_head;
    ppMVar5 = &data_used_memory_head;
  }
  else {
    if (type != 1) {
      pMVar7 = (MemoryNode *)0x0;
      pMVar6 = (MemoryNode *)0x0;
      goto LAB_001046ea;
    }
    ppMVar3 = &code_free_memory_head;
    ppMVar5 = &code_used_memory_head;
  }
  pMVar7 = *ppMVar5;
  pMVar6 = *ppMVar3;
LAB_001046ea:
  do {
    if (pMVar7 == (MemoryNode *)0x0) {
LAB_00104747:
      return pMVar7 != (MemoryNode *)0x0;
    }
    if (pMVar7->address == adr) {
      uVar1 = pMVar7->size;
      pMVar2 = pMVar7->forward;
      pMVar4 = pMVar7->next;
      pMVar2->next = pMVar4;
      if (pMVar4 != (MemoryNode *)0x0) {
        pMVar4->forward = pMVar2;
      }
      operator_delete(pMVar7,0x20);
      pMVar2 = pMVar6->next;
      pMVar4 = (MemoryNode *)operator_new(0x20);
      pMVar4->address = adr;
      pMVar4->size = uVar1;
      pMVar4->forward = pMVar6;
      pMVar4->next = pMVar2;
      pMVar6->next = pMVar4;
      pMVar2->forward = pMVar4;
      goto LAB_00104747;
    }
    pMVar7 = pMVar7->next;
  } while( true );
}

Assistant:

EXPORT bool free_memory(unsigned adr,int type) {
	MemoryNode *used_head=nullptr, *free_head = nullptr;
	init_get_head(type, free_head, used_head);
	MemoryNode * used = used_head;
	unsigned adr_size;
	while (used) //获取使用的链表
	{
		if (used->address == adr) break;
		else used = used->next;
	}
	if (!used) return false;
	else
	{
		adr_size = used->size;
		/*从使用链表中取下*/
		MemoryNode *forword = used->forward;
		MemoryNode *next = used->next;
		forword->next = used->next;
		if (next) next->forward = forword;
		delete(used);

		/*加入未使用的节点采用头插入*/

		MemoryNode *data_first = free_head->next;
		MemoryNode *new_free = new MemoryNode;
		new_free->address = adr;
		new_free->size = adr_size;
		new_free->forward = free_head;
		new_free->next = data_first;
		free_head->next = new_free;
		data_first->forward = new_free;

		return true;
	}
}